

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bilinear_apply_interpolation.h
# Opt level: O0

void ncnn::gridsample_2d_bilinear_apply_interpolation_p8
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  long lVar12;
  long lVar13;
  undefined8 *puVar14;
  undefined8 *in_RDX;
  long *in_RSI;
  long lVar15;
  long *in_RDI;
  __m256 _v;
  __m256 value2;
  __m256 v1;
  __m256 v0;
  __m256 value1;
  __m256 v11_val;
  __m256 v10_val;
  __m256 v01_val;
  __m256 v00_val;
  float *value_ptr;
  int *offset_ptr;
  int i;
  float *offset_value_ptr;
  float *dstptr;
  float *srcptr;
  int q;
  int grid_size;
  int outh;
  int outw;
  int channels;
  Mat *m_2;
  Mat *m;
  Mat *m_1;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  float fStack_c28;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  float fStack_ba8;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  int local_944;
  int *local_8f8;
  undefined1 (*local_8a8) [32];
  int local_83c;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined4 uStack_244;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1a4;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  
  lVar12 = in_RSI[7];
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar13 = in_RSI[6];
  for (local_83c = 0; local_83c < (int)lVar12; local_83c = local_83c + 1) {
    lVar15 = *in_RDI + in_RDI[8] * (long)local_83c * in_RDI[2];
    local_8a8 = (undefined1 (*) [32])(*in_RSI + in_RSI[8] * (long)local_83c * in_RSI[2]);
    local_8f8 = (int *)*in_RDX;
    for (local_944 = 0; local_944 < iVar2 * (int)lVar13; local_944 = local_944 + 1) {
      if (*local_8f8 < 0) {
        auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        local_4c0 = auVar4._0_8_;
        uStack_4b8 = auVar4._8_8_;
        uStack_4b0 = auVar3._0_8_;
        uStack_4a8 = auVar3._8_8_;
        local_b80 = local_4c0;
        uStack_b78 = uStack_4b8;
        uStack_b70 = uStack_4b0;
        uStack_b68 = uStack_4a8;
      }
      else {
        puVar14 = (undefined8 *)(lVar15 + (long)*local_8f8 * 4);
        local_b80 = *puVar14;
        uStack_b78 = puVar14[1];
        uStack_b70 = puVar14[2];
        uStack_b68 = puVar14[3];
      }
      if (local_8f8[1] < 0) {
        auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        local_480 = auVar4._0_8_;
        uStack_478 = auVar4._8_8_;
        uStack_470 = auVar3._0_8_;
        local_bc0 = local_480;
        uStack_bb8 = uStack_478;
        uStack_bb0 = uStack_470;
        fStack_ba8 = auVar3._8_4_;
      }
      else {
        puVar14 = (undefined8 *)(lVar15 + (long)local_8f8[1] * 4);
        local_bc0 = *puVar14;
        uStack_bb8 = puVar14[1];
        uStack_bb0 = puVar14[2];
        fStack_ba8 = (float)puVar14[3];
      }
      if (local_8f8[2] < 0) {
        auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        local_440 = auVar4._0_8_;
        uStack_438 = auVar4._8_8_;
        uStack_430 = auVar3._0_8_;
        uStack_428 = auVar3._8_8_;
        local_c00 = local_440;
        uStack_bf8 = uStack_438;
        uStack_bf0 = uStack_430;
        uStack_be8 = uStack_428;
      }
      else {
        puVar14 = (undefined8 *)(lVar15 + (long)local_8f8[2] * 4);
        local_c00 = *puVar14;
        uStack_bf8 = puVar14[1];
        uStack_bf0 = puVar14[2];
        uStack_be8 = puVar14[3];
      }
      if (local_8f8[3] < 0) {
        auVar3 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(0),0x30);
        auVar4 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416(0),0x30);
        local_400 = auVar4._0_8_;
        uStack_3f8 = auVar4._8_8_;
        uStack_3f0 = auVar3._0_8_;
        local_c40 = local_400;
        uStack_c38 = uStack_3f8;
        uStack_c30 = uStack_3f0;
        fStack_c28 = auVar3._8_4_;
      }
      else {
        puVar14 = (undefined8 *)(lVar15 + (long)local_8f8[3] * 4);
        local_c40 = *puVar14;
        uStack_c38 = puVar14[1];
        uStack_c30 = puVar14[2];
        fStack_c28 = (float)puVar14[3];
      }
      uVar1 = local_8f8[4];
      auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar11._8_8_ = uStack_b78;
      auVar11._0_8_ = local_b80;
      auVar11._16_8_ = uStack_b70;
      auVar11._24_8_ = uStack_b68;
      local_260 = (float)local_b80;
      fStack_25c = (float)((ulong)local_b80 >> 0x20);
      fStack_258 = (float)uStack_b78;
      fStack_254 = (float)((ulong)uStack_b78 >> 0x20);
      fStack_250 = (float)uStack_b70;
      fStack_24c = (float)((ulong)uStack_b70 >> 0x20);
      fStack_248 = (float)uStack_b68;
      uStack_244 = (undefined4)((ulong)uStack_b68 >> 0x20);
      local_280 = auVar3._0_4_;
      fStack_27c = auVar3._4_4_;
      fStack_278 = auVar3._8_4_;
      fStack_274 = auVar3._12_4_;
      fStack_270 = auVar4._0_4_;
      fStack_26c = auVar4._4_4_;
      fStack_268 = auVar4._8_4_;
      auVar6._4_4_ = fStack_25c * fStack_27c;
      auVar6._0_4_ = local_260 * local_280;
      auVar6._8_4_ = fStack_258 * fStack_278;
      auVar6._12_4_ = fStack_254 * fStack_274;
      auVar6._16_4_ = fStack_250 * fStack_270;
      auVar6._20_4_ = fStack_24c * fStack_26c;
      auVar6._24_4_ = fStack_248 * fStack_268;
      auVar6._28_4_ = uStack_244;
      auVar5 = vsubps_avx(auVar11,auVar6);
      local_1a0 = (float)local_bc0;
      fStack_19c = (float)((ulong)local_bc0 >> 0x20);
      fStack_198 = (float)uStack_bb8;
      fStack_194 = (float)((ulong)uStack_bb8 >> 0x20);
      fStack_190 = (float)uStack_bb0;
      fStack_18c = (float)((ulong)uStack_bb0 >> 0x20);
      fStack_1a4 = auVar4._12_4_;
      local_340 = auVar5._0_4_;
      fStack_33c = auVar5._4_4_;
      fStack_338 = auVar5._8_4_;
      fStack_334 = auVar5._12_4_;
      fStack_330 = auVar5._16_4_;
      fStack_32c = auVar5._20_4_;
      fStack_328 = auVar5._24_4_;
      fStack_324 = auVar5._28_4_;
      local_340 = local_1a0 * local_280 + local_340;
      fStack_33c = fStack_19c * fStack_27c + fStack_33c;
      fStack_338 = fStack_198 * fStack_278 + fStack_338;
      fStack_334 = fStack_194 * fStack_274 + fStack_334;
      fStack_330 = fStack_190 * fStack_270 + fStack_330;
      fStack_32c = fStack_18c * fStack_26c + fStack_32c;
      fStack_328 = fStack_ba8 * fStack_268 + fStack_328;
      auVar10._8_8_ = uStack_bf8;
      auVar10._0_8_ = local_c00;
      auVar10._16_8_ = uStack_bf0;
      auVar10._24_8_ = uStack_be8;
      local_220 = (float)local_c00;
      fStack_21c = (float)((ulong)local_c00 >> 0x20);
      fStack_218 = (float)uStack_bf8;
      fStack_214 = (float)((ulong)uStack_bf8 >> 0x20);
      fStack_210 = (float)uStack_bf0;
      fStack_20c = (float)((ulong)uStack_bf0 >> 0x20);
      fStack_208 = (float)uStack_be8;
      uStack_204 = (undefined4)((ulong)uStack_be8 >> 0x20);
      auVar7._4_4_ = fStack_21c * fStack_27c;
      auVar7._0_4_ = local_220 * local_280;
      auVar7._8_4_ = fStack_218 * fStack_278;
      auVar7._12_4_ = fStack_214 * fStack_274;
      auVar7._16_4_ = fStack_210 * fStack_270;
      auVar7._20_4_ = fStack_20c * fStack_26c;
      auVar7._24_4_ = fStack_208 * fStack_268;
      auVar7._28_4_ = uStack_204;
      auVar5 = vsubps_avx(auVar10,auVar7);
      local_160 = (float)local_c40;
      fStack_15c = (float)((ulong)local_c40 >> 0x20);
      fStack_158 = (float)uStack_c38;
      fStack_154 = (float)((ulong)uStack_c38 >> 0x20);
      fStack_150 = (float)uStack_c30;
      fStack_14c = (float)((ulong)uStack_c30 >> 0x20);
      local_300 = auVar5._0_4_;
      fStack_2fc = auVar5._4_4_;
      fStack_2f8 = auVar5._8_4_;
      fStack_2f4 = auVar5._12_4_;
      fStack_2f0 = auVar5._16_4_;
      fStack_2ec = auVar5._20_4_;
      fStack_2e8 = auVar5._24_4_;
      fStack_2e4 = auVar5._28_4_;
      uVar1 = local_8f8[5];
      auVar3 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(uVar1),0x30);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar9._4_4_ = fStack_33c;
      auVar9._0_4_ = local_340;
      auVar9._8_4_ = fStack_338;
      auVar9._12_4_ = fStack_334;
      auVar9._16_4_ = fStack_330;
      auVar9._20_4_ = fStack_32c;
      auVar9._24_4_ = fStack_328;
      auVar9._28_4_ = fStack_1a4 + fStack_324;
      local_200 = auVar4._0_4_;
      fStack_1fc = auVar4._4_4_;
      fStack_1f8 = auVar4._8_4_;
      fStack_1f4 = auVar4._12_4_;
      fStack_1f0 = auVar3._0_4_;
      fStack_1ec = auVar3._4_4_;
      fStack_1e8 = auVar3._8_4_;
      auVar8._4_4_ = fStack_33c * fStack_1fc;
      auVar8._0_4_ = local_340 * local_200;
      auVar8._8_4_ = fStack_338 * fStack_1f8;
      auVar8._12_4_ = fStack_334 * fStack_1f4;
      auVar8._16_4_ = fStack_330 * fStack_1f0;
      auVar8._20_4_ = fStack_32c * fStack_1ec;
      auVar8._24_4_ = fStack_328 * fStack_1e8;
      auVar8._28_4_ = fStack_1a4 + fStack_324;
      auVar5 = vsubps_avx(auVar9,auVar8);
      local_2c0 = auVar5._0_4_;
      fStack_2bc = auVar5._4_4_;
      fStack_2b8 = auVar5._8_4_;
      fStack_2b4 = auVar5._12_4_;
      fStack_2b0 = auVar5._16_4_;
      fStack_2ac = auVar5._20_4_;
      fStack_2a8 = auVar5._24_4_;
      fStack_2a4 = auVar5._28_4_;
      auVar5._4_4_ = (fStack_15c * fStack_27c + fStack_2fc) * fStack_1fc + fStack_2bc;
      auVar5._0_4_ = (local_160 * local_280 + local_300) * local_200 + local_2c0;
      auVar5._12_4_ = (fStack_154 * fStack_274 + fStack_2f4) * fStack_1f4 + fStack_2b4;
      auVar5._8_4_ = (fStack_158 * fStack_278 + fStack_2f8) * fStack_1f8 + fStack_2b8;
      auVar5._20_4_ = (fStack_14c * fStack_26c + fStack_2ec) * fStack_1ec + fStack_2ac;
      auVar5._16_4_ = (fStack_150 * fStack_270 + fStack_2f0) * fStack_1f0 + fStack_2b0;
      auVar5._28_4_ = fStack_1a4 + fStack_2e4 + fStack_2a4;
      auVar5._24_4_ = (fStack_c28 * fStack_268 + fStack_2e8) * fStack_1e8 + fStack_2a8;
      *local_8a8 = auVar5;
      local_8a8 = local_8a8 + 1;
      local_8f8 = local_8f8 + 6;
    }
  }
  return;
}

Assistant:

static void gridsample_2d_bilinear_apply_interpolation_p8(const Mat& src, Mat& dst, const Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            const int* offset_ptr = (int*)offset_value_ptr;
            const float* value_ptr = offset_value_ptr + 4;

            __m256 v00_val = offset_ptr[0] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[0]) : _mm256_set1_ps(0);
            __m256 v01_val = offset_ptr[1] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[1]) : _mm256_set1_ps(0);
            __m256 v10_val = offset_ptr[2] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[2]) : _mm256_set1_ps(0);
            __m256 v11_val = offset_ptr[3] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[3]) : _mm256_set1_ps(0);

            __m256 value1 = _mm256_set1_ps(value_ptr[0]);
            __m256 v0 = _mm256_comp_fmadd_ps(v01_val, value1, _mm256_comp_fnmadd_ps(v00_val, value1, v00_val));
            __m256 v1 = _mm256_comp_fmadd_ps(v11_val, value1, _mm256_comp_fnmadd_ps(v10_val, value1, v10_val));

            __m256 value2 = _mm256_set1_ps(value_ptr[1]);
            __m256 _v = _mm256_comp_fmadd_ps(v1, value2, _mm256_comp_fnmadd_ps(v0, value2, v0));
            _mm256_storeu_ps(dstptr, _v);

            dstptr += 8;
            offset_value_ptr += 6;
        }
    }
}